

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_pack_headers
              (nghttp2_bufs *bufs,nghttp2_headers *frame,nghttp2_hd_deflater *deflater)

{
  nghttp2_buf_chain *pnVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  int iVar6;
  
  pnVar1 = bufs->cur;
  if (bufs->head == pnVar1) {
    bVar2 = (frame->hd).flags & 0x20;
    puVar4 = (pnVar1->buf).pos + (ulong)(bVar2 >> 5) * 5;
    (pnVar1->buf).pos = puVar4;
    (pnVar1->buf).last = puVar4;
    iVar3 = nghttp2_hd_deflate_hd_bufs(deflater,bufs,frame->nva,frame->nvlen);
    iVar6 = -0x20b;
    if (iVar3 != -0x1f6) {
      iVar6 = iVar3;
    }
    puVar4 = (pnVar1->buf).pos + (ulong)(bVar2 == 0) * 5 + -5;
    (pnVar1->buf).pos = puVar4;
    if (iVar6 == 0) {
      if (((frame->hd).flags & 0x20) != 0) {
        nghttp2_frame_pack_priority_spec(puVar4,&frame->pri_spec);
      }
      frame->padlen = 0;
      sVar5 = nghttp2_bufs_len(bufs);
      (frame->hd).length = sVar5;
      frame_pack_headers_shared(bufs,&frame->hd);
    }
    return iVar6;
  }
  __assert_fail("bufs->head == bufs->cur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x16f,
                "int nghttp2_frame_pack_headers(nghttp2_bufs *, nghttp2_headers *, nghttp2_hd_deflater *)"
               );
}

Assistant:

int nghttp2_frame_pack_headers(nghttp2_bufs *bufs, nghttp2_headers *frame,
                               nghttp2_hd_deflater *deflater) {
  size_t nv_offset;
  int rv;
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  nv_offset = nghttp2_frame_headers_payload_nv_offset(frame);

  buf = &bufs->cur->buf;

  buf->pos += nv_offset;
  buf->last = buf->pos;

  /* This call will adjust buf->last to the correct position */
  rv = nghttp2_hd_deflate_hd_bufs(deflater, bufs, frame->nva, frame->nvlen);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    rv = NGHTTP2_ERR_HEADER_COMP;
  }

  buf->pos -= nv_offset;

  if (rv != 0) {
    return rv;
  }

  if (frame->hd.flags & NGHTTP2_FLAG_PRIORITY) {
    nghttp2_frame_pack_priority_spec(buf->pos, &frame->pri_spec);
  }

  frame->padlen = 0;
  frame->hd.length = nghttp2_bufs_len(bufs);

  return frame_pack_headers_shared(bufs, &frame->hd);
}